

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder.c
# Opt level: O0

lzma_ret lzma_lzma_encoder_reset(lzma_coder_conflict9 *coder,lzma_options_lzma *options)

{
  _Bool _Var1;
  uint local_38;
  uint local_34;
  uint32_t bt_i_1;
  uint32_t bt_i;
  size_t j;
  size_t i;
  lzma_options_lzma *options_local;
  lzma_coder_conflict9 *coder_local;
  
  _Var1 = is_options_valid(options);
  if (_Var1) {
    coder->pos_mask = (1 << ((byte)options->pb & 0x1f)) - 1;
    coder->literal_context_bits = options->lc;
    coder->literal_pos_mask = (1 << ((byte)options->lp & 0x1f)) - 1;
    rc_reset(&coder->rc);
    coder->state = STATE_LIT_LIT;
    for (j = 0; j < 4; j = j + 1) {
      coder->reps[j] = 0;
    }
    literal_init(coder->literal,options->lc,options->lp);
    for (j = 0; j < 0xc; j = j + 1) {
      for (_bt_i_1 = 0; _bt_i_1 <= coder->pos_mask; _bt_i_1 = _bt_i_1 + 1) {
        coder->is_match[j][_bt_i_1] = 0x400;
        coder->is_rep0_long[j][_bt_i_1] = 0x400;
      }
      coder->is_rep[j] = 0x400;
      coder->is_rep0[j] = 0x400;
      coder->is_rep1[j] = 0x400;
      coder->is_rep2[j] = 0x400;
    }
    for (j = 0; j < 0x72; j = j + 1) {
      coder->pos_special[j] = 0x400;
    }
    for (j = 0; j < 4; j = j + 1) {
      for (local_34 = 0; local_34 < 0x40; local_34 = local_34 + 1) {
        coder->pos_slot[j][local_34] = 0x400;
      }
    }
    for (local_38 = 0; local_38 < 0x10; local_38 = local_38 + 1) {
      coder->pos_align[local_38] = 0x400;
    }
    length_encoder_reset
              (&coder->match_len_encoder,1 << ((byte)options->pb & 0x1f),
               (_Bool)(coder->fast_mode & 1));
    length_encoder_reset
              (&coder->rep_len_encoder,1 << ((byte)options->pb & 0x1f),(_Bool)(coder->fast_mode & 1)
              );
    coder->match_price_count = 0x7fffffff;
    coder->align_price_count = 0x7fffffff;
    coder->opts_end_index = 0;
    coder->opts_current_index = 0;
    coder_local._4_4_ = LZMA_OK;
  }
  else {
    coder_local._4_4_ = LZMA_OPTIONS_ERROR;
  }
  return coder_local._4_4_;
}

Assistant:

extern lzma_ret
lzma_lzma_encoder_reset(lzma_coder *coder, const lzma_options_lzma *options)
{
	size_t i, j;

	if (!is_options_valid(options))
		return LZMA_OPTIONS_ERROR;

	coder->pos_mask = (1U << options->pb) - 1;
	coder->literal_context_bits = options->lc;
	coder->literal_pos_mask = (1U << options->lp) - 1;

	// Range coder
	rc_reset(&coder->rc);

	// State
	coder->state = STATE_LIT_LIT;
	for (i = 0; i < REP_DISTANCES; ++i)
		coder->reps[i] = 0;

	literal_init(coder->literal, options->lc, options->lp);

	// Bit encoders
	for (i = 0; i < STATES; ++i) {
		for (j = 0; j <= coder->pos_mask; ++j) {
			bit_reset(coder->is_match[i][j]);
			bit_reset(coder->is_rep0_long[i][j]);
		}

		bit_reset(coder->is_rep[i]);
		bit_reset(coder->is_rep0[i]);
		bit_reset(coder->is_rep1[i]);
		bit_reset(coder->is_rep2[i]);
	}

	for (i = 0; i < FULL_DISTANCES - END_POS_MODEL_INDEX; ++i)
		bit_reset(coder->pos_special[i]);

	// Bit tree encoders
	for (i = 0; i < LEN_TO_POS_STATES; ++i)
		bittree_reset(coder->pos_slot[i], POS_SLOT_BITS);

	bittree_reset(coder->pos_align, ALIGN_BITS);

	// Length encoders
	length_encoder_reset(&coder->match_len_encoder,
			1U << options->pb, coder->fast_mode);

	length_encoder_reset(&coder->rep_len_encoder,
			1U << options->pb, coder->fast_mode);

	// Price counts are incremented every time appropriate probabilities
	// are changed. price counts are set to zero when the price tables
	// are updated, which is done when the appropriate price counts have
	// big enough value, and lzma_mf.read_ahead == 0 which happens at
	// least every OPTS (a few thousand) possible price count increments.
	//
	// By resetting price counts to UINT32_MAX / 2, we make sure that the
	// price tables will be initialized before they will be used (since
	// the value is definitely big enough), and that it is OK to increment
	// price counts without risk of integer overflow (since UINT32_MAX / 2
	// is small enough). The current code doesn't increment price counts
	// before initializing price tables, but it maybe done in future if
	// we add support for saving the state between LZMA2 chunks.
	coder->match_price_count = UINT32_MAX / 2;
	coder->align_price_count = UINT32_MAX / 2;

	coder->opts_end_index = 0;
	coder->opts_current_index = 0;

	return LZMA_OK;
}